

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O1

xmlCatalogPtr xmlLoadSGMLSuperCatalog(char *filename)

{
  int iVar1;
  xmlChar *value;
  xmlCatalogPtr catal;
  
  value = xmlLoadFileContent(filename);
  if (value != (xmlChar *)0x0) {
    catal = xmlCreateNewCatalog(XML_SGML_CATALOG_TYPE,xmlCatalogDefaultPrefer);
    if (catal == (xmlCatalogPtr)0x0) {
      (*xmlFree)(value);
    }
    else {
      iVar1 = xmlParseSGMLCatalog(catal,value,filename,1);
      (*xmlFree)(value);
      if (-1 < iVar1) {
        return catal;
      }
      xmlFreeCatalog(catal);
    }
  }
  return (xmlCatalogPtr)0x0;
}

Assistant:

xmlCatalogPtr
xmlLoadSGMLSuperCatalog(const char *filename)
{
    xmlChar *content;
    xmlCatalogPtr catal;
    int ret;

    content = xmlLoadFileContent(filename);
    if (content == NULL)
        return(NULL);

    catal = xmlCreateNewCatalog(XML_SGML_CATALOG_TYPE, xmlCatalogDefaultPrefer);
    if (catal == NULL) {
	xmlFree(content);
	return(NULL);
    }

    ret = xmlParseSGMLCatalog(catal, content, filename, 1);
    xmlFree(content);
    if (ret < 0) {
	xmlFreeCatalog(catal);
	return(NULL);
    }
    return (catal);
}